

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::SetBlendFactors
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,float *BlendFactors,int param_2)

{
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Char *pCVar3;
  COMMAND_QUEUE_TYPE Type;
  char (*in_R9) [8];
  uint local_b8;
  Uint32 f;
  bool FactorsDiffer;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  float *BlendFactors_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)local_40,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetBlendFactors",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x36c);
      std::__cxx11::string::~string((string *)local_40);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"SetBlendFactors",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x36c);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar2 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    GetCommandQueueTypeString_abi_cxx11_
              ((String *)&f,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    FormatString<char[16],char[22],std::__cxx11::string,char[8]>
              ((string *)local_90,(Diligent *)"SetBlendFactors",(char (*) [16])0xf4cb59,
               (char (*) [22])&f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&f);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"SetBlendFactors",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x36c);
    std::__cxx11::string::~string((string *)local_90);
  }
  bVar1 = false;
  for (local_b8 = 0; local_b8 < 4; local_b8 = local_b8 + 1) {
    if (((float)this->m_BlendFactors[local_b8] != BlendFactors[local_b8]) ||
       (NAN((float)this->m_BlendFactors[local_b8]) || NAN(BlendFactors[local_b8]))) {
      bVar1 = true;
    }
    this->m_BlendFactors[local_b8] = (Float32)BlendFactors[local_b8];
  }
  if (bVar1) {
    (this->m_Stats).CommandCounters.SetBlendFactors =
         (this->m_Stats).CommandCounters.SetBlendFactors + 1;
  }
  return bVar1;
}

Assistant:

inline bool DeviceContextBase<ImplementationTraits>::SetBlendFactors(const float* BlendFactors, int)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetBlendFactors");

    bool FactorsDiffer = false;
    for (Uint32 f = 0; f < 4; ++f)
    {
        if (m_BlendFactors[f] != BlendFactors[f])
            FactorsDiffer = true;
        m_BlendFactors[f] = BlendFactors[f];
    }
    if (FactorsDiffer)
        ++m_Stats.CommandCounters.SetBlendFactors;

    return FactorsDiffer;
}